

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockSupport_c_outputParameters_differentType_TestShell::createTest
          (TEST_MockSupport_c_outputParameters_differentType_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
                                  ,0xd3);
  TEST_MockSupport_c_outputParameters_differentType_Test::
  TEST_MockSupport_c_outputParameters_differentType_Test
            ((TEST_MockSupport_c_outputParameters_differentType_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockSupport_c, outputParameters_differentType)
{
    long param = 1;
    const long retval = 2;
    mock_c()->expectOneCall("foo")->withOutputParameterReturning("out", &retval, sizeof(retval));
    mock_c()->actualCall("foo")->withOutputParameter("out", &param);
    mock_c()->checkExpectations();
    LONGS_EQUAL(2, param);
    LONGS_EQUAL(2, retval);
}